

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_Response_NACK_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Minefield_Response_NACK_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Minefield_Response_NACK_PDU *this)

{
  byte *pbVar1;
  ostream *poVar2;
  byte *pbVar3;
  KStringStream ss;
  KString KStack_218;
  KString local_1f8;
  KString local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_1d8,(Header7 *)this);
  poVar2 = std::operator<<(local_1a8,(string *)&local_1d8);
  poVar2 = std::operator<<(poVar2,"-Minefield Response NACK PDU-\n");
  Minefield_Header::GetAsString_abi_cxx11_(&local_1f8,&this->super_Minefield_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
  poVar2 = std::operator<<(poVar2,"Requesting Entity ID.: ");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&KStack_218,&this->m_ReqID);
  poVar2 = std::operator<<(poVar2,(string *)&KStack_218);
  poVar2 = std::operator<<(poVar2,"Request ID: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8ReqID);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"Number Missing PDU\'s: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)this->m_ui8NumMisPdus);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"Missing PDU Sequence Numbers:\n");
  std::__cxx11::string::~string((string *)&KStack_218);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  pbVar1 = (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pbVar3 = (this->m_vSeqNums).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1) {
    poVar2 = std::operator<<(local_1a8,"\t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(ushort)*pbVar3);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString Minefield_Response_NACK_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Minefield Response NACK PDU-\n"
       << Minefield_Header::GetAsString()
       << "Requesting Entity ID.: " << m_ReqID.GetAsString()
       << "Request ID: "            << ( KUINT16 )m_ui8ReqID        << "\n"
       << "Number Missing PDU's: "  << ( KUINT16 )m_ui8NumMisPdus   << "\n"
       << "Missing PDU Sequence Numbers:\n";

    vector<KUINT8>::const_iterator citr = m_vSeqNums.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vSeqNums.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << "\t" << ( KUINT16 )*citr << "\n";
    }

    return ss.str();
}